

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

int SortByDominancePreOrder(void *a,void *b)

{
  uint uVar1;
  uint uVar2;
  VmInstruction *a_00;
  VmInstruction *b_00;
  bool bVar3;
  int iVar4;
  
  a_00 = *a;
  b_00 = *b;
  uVar1 = b_00->parent->dominanceGraphPreOrderId;
  uVar2 = a_00->parent->dominanceGraphPreOrderId;
  if (uVar2 < uVar1) {
    iVar4 = -1;
  }
  else {
    iVar4 = 1;
    if (uVar2 <= uVar1) {
      bVar3 = IsAfter(a_00,b_00);
      if (!bVar3) {
        bVar3 = IsAfter(b_00,a_00);
        iVar4 = -(uint)bVar3;
      }
    }
  }
  return iVar4;
}

Assistant:

int SortByDominancePreOrder(const void* a, const void* b)
{
	VmInstruction *aInst = *(VmInstruction**)a;
	VmInstruction *bInst = *(VmInstruction**)b;

	if(aInst->parent->dominanceGraphPreOrderId < bInst->parent->dominanceGraphPreOrderId)
		return -1;

	if(aInst->parent->dominanceGraphPreOrderId > bInst->parent->dominanceGraphPreOrderId)
		return 1;

	if(IsAfter(aInst, bInst))
		return 1;

	if(IsAfter(bInst, aInst))
		return -1;

	return 0;
}